

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O2

string * __thiscall
MADPComponentDiscreteStates::SoftPrintStates_abi_cxx11_
          (string *__return_storage_ptr__,MADPComponentDiscreteStates *this)

{
  pointer pSVar1;
  pointer pSVar2;
  stringstream ss;
  string local_1d0 [32];
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  pSVar1 = (this->_m_stateVec).super__Vector_base<StateDiscrete,_std::allocator<StateDiscrete>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pSVar2 = (this->_m_stateVec).
                super__Vector_base<StateDiscrete,_std::allocator<StateDiscrete>_>._M_impl.
                super__Vector_impl_data._M_start; pSVar2 != pSVar1; pSVar2 = pSVar2 + 1) {
    (*(pSVar2->super_State).super_NamedDescribedEntity._vptr_NamedDescribedEntity[2])
              (local_1d0,pSVar2);
    std::operator<<(local_1a0,local_1d0);
    std::__cxx11::string::~string(local_1d0);
    std::endl<char,std::char_traits<char>>(local_1a0);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

string MADPComponentDiscreteStates::SoftPrintStates() const
{    
    stringstream ss;
    vector<StateDiscrete>::const_iterator it = _m_stateVec.begin();
    vector<StateDiscrete>::const_iterator last = _m_stateVec.end();
    while(it!=last)
    {
        ss << (*it).SoftPrint();
        ss << endl;
        it++;
    }
    return(ss.str());
}